

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::~BasicReporter(BasicReporter *this)

{
  ~BasicReporter(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

BasicReporter::~BasicReporter() {}